

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O3

CURLcode concat_url(char *base,char *relurl,char **newurl)

{
  char *pcVar1;
  char cVar2;
  CURLcode CVar3;
  CURLUcode CVar4;
  char *sep;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  size_t len;
  char *pcVar8;
  _Bool relative;
  int iVar9;
  char cVar10;
  dynbuf newest;
  dynbuf local_50;
  
  *newurl = (char *)0x0;
  pcVar5 = strstr(base,"//");
  pcVar8 = pcVar5 + 2;
  if (pcVar5 == (char *)0x0) {
    pcVar8 = base;
  }
  cVar2 = *relurl;
  if (cVar2 == '/') {
    if (relurl[1] == '/') {
      *pcVar8 = '\0';
      relurl = relurl + 2;
      relative = false;
    }
    else {
      pcVar5 = strchr(pcVar8,0x2f);
      pcVar7 = strchr(pcVar8,0x3f);
      if (pcVar5 == (char *)0x0) {
        relative = true;
        if (pcVar7 != (char *)0x0) {
          *pcVar7 = '\0';
        }
      }
      else {
        pcVar6 = pcVar5;
        if (pcVar7 < pcVar5) {
          pcVar6 = pcVar7;
        }
        if (pcVar7 == (char *)0x0) {
          pcVar6 = pcVar5;
        }
        *pcVar6 = '\0';
        relative = true;
      }
    }
  }
  else {
    pcVar5 = strchr(pcVar8,0x3f);
    if (pcVar5 != (char *)0x0) {
      *pcVar5 = '\0';
      cVar2 = *relurl;
    }
    cVar10 = '?';
    if ((cVar2 != '?') && (pcVar5 = strrchr(pcVar8,0x2f), cVar10 = cVar2, pcVar5 != (char *)0x0)) {
      *pcVar5 = '\0';
      cVar10 = *relurl;
    }
    pcVar6 = strchr(pcVar8,0x2f);
    pcVar5 = pcVar6 + 1;
    pcVar7 = pcVar5;
    if (pcVar6 == (char *)0x0) {
      pcVar7 = (char *)0x0;
    }
    iVar9 = 0;
    if ((cVar10 == '.') &&
       (relurl = relurl + (ulong)(relurl[1] == '/') * 2, iVar9 = 0, *relurl == '.')) {
      iVar9 = 0;
      pcVar8 = relurl;
      do {
        relurl = pcVar8;
        if ((pcVar8[1] != '.') || (pcVar8[2] != '/')) break;
        iVar9 = iVar9 + 1;
        relurl = pcVar8 + 3;
        pcVar1 = pcVar8 + 3;
        pcVar8 = relurl;
      } while (*pcVar1 == '.');
    }
    relative = true;
    pcVar8 = pcVar5;
    if (pcVar6 == (char *)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      for (; iVar9 != 0; iVar9 = iVar9 + -1) {
        pcVar8 = strrchr(pcVar7,0x2f);
        if (pcVar8 == (char *)0x0) {
          *pcVar7 = '\0';
          pcVar8 = pcVar5;
          break;
        }
        *pcVar8 = '\0';
        pcVar8 = pcVar7;
      }
    }
  }
  Curl_dyn_init(&local_50,8000000);
  CVar3 = Curl_dyn_add(&local_50,base);
  if (CVar3 != CURLE_OK) {
    return CVar3;
  }
  cVar2 = *relurl;
  if (cVar2 != '/') {
    if (pcVar8 == (char *)0x0) {
      if (cVar2 == '?') goto LAB_006146bc;
    }
    else if ((cVar2 == '?') || (*pcVar8 == '\0')) goto LAB_006146bc;
    CVar3 = Curl_dyn_addn(&local_50,"/",1);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
  }
LAB_006146bc:
  len = strlen(relurl);
  CVar3 = CURLE_OK;
  CVar4 = urlencode_str(&local_50,relurl,len,relative,false);
  if (CVar4 == CURLUE_OK) {
    pcVar8 = Curl_dyn_ptr(&local_50);
    *newurl = pcVar8;
  }
  else {
    CVar3 = CURLE_OUT_OF_MEMORY;
    if (CVar4 == CURLUE_TOO_LARGE) {
      CVar3 = CURLE_TOO_LARGE;
    }
  }
  return CVar3;
}

Assistant:

static CURLcode concat_url(char *base, const char *relurl, char **newurl)
{
  /***
   TRY to append this new path to the old URL
   to the right of the host part. Oh crap, this is doomed to cause
   problems in the future...
  */
  struct dynbuf newest;
  char *protsep;
  char *pathsep;
  bool host_changed = FALSE;
  const char *useurl = relurl;
  CURLcode result = CURLE_OK;
  CURLUcode uc;
  *newurl = NULL;

  /* protsep points to the start of the host name */
  protsep = strstr(base, "//");
  if(!protsep)
    protsep = base;
  else
    protsep += 2; /* pass the slashes */

  if('/' != relurl[0]) {
    int level = 0;

    /* First we need to find out if there's a ?-letter in the URL,
       and cut it and the right-side of that off */
    pathsep = strchr(protsep, '?');
    if(pathsep)
      *pathsep = 0;

    /* we have a relative path to append to the last slash if there's one
       available, or if the new URL is just a query string (starts with a
       '?')  we append the new one at the end of the entire currently worked
       out URL */
    if(useurl[0] != '?') {
      pathsep = strrchr(protsep, '/');
      if(pathsep)
        *pathsep = 0;
    }

    /* Check if there's any slash after the host name, and if so, remember
       that position instead */
    pathsep = strchr(protsep, '/');
    if(pathsep)
      protsep = pathsep + 1;
    else
      protsep = NULL;

    /* now deal with one "./" or any amount of "../" in the newurl
       and act accordingly */

    if((useurl[0] == '.') && (useurl[1] == '/'))
      useurl += 2; /* just skip the "./" */

    while((useurl[0] == '.') &&
          (useurl[1] == '.') &&
          (useurl[2] == '/')) {
      level++;
      useurl += 3; /* pass the "../" */
    }

    if(protsep) {
      while(level--) {
        /* cut off one more level from the right of the original URL */
        pathsep = strrchr(protsep, '/');
        if(pathsep)
          *pathsep = 0;
        else {
          *protsep = 0;
          break;
        }
      }
    }
  }
  else {
    /* We got a new absolute path for this server */

    if(relurl[1] == '/') {
      /* the new URL starts with //, just keep the protocol part from the
         original one */
      *protsep = 0;
      useurl = &relurl[2]; /* we keep the slashes from the original, so we
                              skip the new ones */
      host_changed = TRUE;
    }
    else {
      /* cut off the original URL from the first slash, or deal with URLs
         without slash */
      pathsep = strchr(protsep, '/');
      if(pathsep) {
        /* When people use badly formatted URLs, such as
           "http://www.example.com?dir=/home/daniel" we must not use the first
           slash, if there's a ?-letter before it! */
        char *sep = strchr(protsep, '?');
        if(sep && (sep < pathsep))
          pathsep = sep;
        *pathsep = 0;
      }
      else {
        /* There was no slash. Now, since we might be operating on a badly
           formatted URL, such as "http://www.example.com?id=2380" which
           doesn't use a slash separator as it is supposed to, we need to check
           for a ?-letter as well! */
        pathsep = strchr(protsep, '?');
        if(pathsep)
          *pathsep = 0;
      }
    }
  }

  Curl_dyn_init(&newest, CURL_MAX_INPUT_LENGTH);

  /* copy over the root url part */
  result = Curl_dyn_add(&newest, base);
  if(result)
    return result;

  /* check if we need to append a slash */
  if(('/' == useurl[0]) || (protsep && !*protsep) || ('?' == useurl[0]))
    ;
  else {
    result = Curl_dyn_addn(&newest, "/", 1);
    if(result)
      return result;
  }

  /* then append the new piece on the right side */
  uc = urlencode_str(&newest, useurl, strlen(useurl), !host_changed,
                     FALSE);
  if(uc)
    return (uc == CURLUE_TOO_LARGE) ? CURLE_TOO_LARGE : CURLE_OUT_OF_MEMORY;

  *newurl = Curl_dyn_ptr(&newest);
  return CURLE_OK;
}